

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::draw_grid(Fluid *this,mat4 *projection,mat4 *view,int display_mode)

{
  PFNGLDRAWARRAYSPROC p_Var1;
  PFNGLUNIFORM1IPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  PFNGLUNIFORM3IVPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  GLint GVar6;
  int iVar7;
  float *pfVar8;
  int *piVar9;
  socklen_t __len;
  PFNGLUNIFORM1IPROC p_Var10;
  sockaddr *__addr;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  int local_24;
  mat4 *pmStack_20;
  int display_mode_local;
  mat4 *view_local;
  mat4 *projection_local;
  Fluid *this_local;
  
  local_24 = display_mode;
  pmStack_20 = view;
  view_local = projection;
  projection_local = (mat4 *)this;
  gfx::Program::use(&this->grid_program);
  p_Var3 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"bounds_min",&local_49);
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_48);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_min);
  (*p_Var3)(GVar6,1,pfVar8);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  p_Var3 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"bounds_max",&local_81);
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_80);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_max);
  (*p_Var3)(GVar6,1,pfVar8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  p_Var4 = glad_glUniform3iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"grid_dim",&local_a9);
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_a8);
  piVar9 = glm::value_ptr<int,(glm::qualifier)0>(&this->grid_dimensions);
  (*p_Var4)(GVar6,1,piVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  p_Var5 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"projection",&local_d1);
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_d0);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var5)(GVar6,1,'\0',pfVar8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  p_Var5 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"view",&local_f9);
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_f8);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(pmStack_20);
  (*p_Var5)(GVar6,1,'\0',pfVar8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  p_Var2 = glad_glUniform1i;
  p_Var10 = glad_glUniform1i;
  std::allocator<char>::allocator();
  __len = (socklen_t)p_Var10;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"display_mode",&local_121)
  ;
  GVar6 = gfx::Program::uniform_loc(&this->grid_program,&local_120);
  iVar7 = local_24;
  (*p_Var2)(GVar6,local_24);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  gfx::VAO::bind(&this->grid_vao,iVar7,__addr,__len);
  (*glad_glPointSize)(16.0);
  p_Var1 = glad_glDrawArrays;
  iVar7 = gfx::Buffer::length(&this->grid_ssbo);
  (*p_Var1)(0,0,iVar7);
  gfx::VAO::unbind(&this->grid_vao);
  gfx::Program::disuse(&this->grid_program);
  return;
}

Assistant:

void draw_grid(const glm::mat4& projection, const glm::mat4& view, int display_mode) {
        grid_program.use();
        glUniform3fv(grid_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniformMatrix4fv(grid_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(grid_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform1i(grid_program.uniform_loc("display_mode"), display_mode);
        grid_vao.bind();
        glPointSize(16.0);
        glDrawArrays(GL_POINTS, 0, grid_ssbo.length());
        grid_vao.unbind();
        grid_program.disuse();
    }